

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O3

int __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::autoHashSize
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  uVar2 = 0;
  if (0 < this->nprimes) {
    iVar5 = (int)((ulong)((long)(this->m_elem).data.
                                super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_elem).data.
                               super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    iVar6 = iVar5 * -0x55555555;
    iVar4 = this->nprimes + -1;
    do {
      uVar7 = (uint)(iVar4 + (int)uVar2) >> 1;
      iVar1 = this->primes[uVar7];
      if (iVar1 == iVar6 || SBORROW4(iVar1,iVar6) != iVar1 + iVar5 * 0x55555555 < 0) {
        if (SBORROW4(iVar1,iVar6) == iVar1 + iVar5 * 0x55555555 < 0) {
          piVar3 = this->primes + (uVar7 + 1);
          goto LAB_00173761;
        }
        uVar2 = (ulong)(uVar7 + 1);
      }
      else {
        iVar4 = uVar7 - 1;
      }
    } while ((int)uVar2 <= iVar4);
  }
  piVar3 = this->primes + uVar2;
LAB_00173761:
  return *piVar3;
}

Assistant:

int autoHashSize() const
   {
      auto oldsize = m_elem.size();

      int left = 0;
      int right = nprimes - 1;
      int middle;

      while(left <= right)
      {
         middle = (left + right) / 2;

         if(oldsize < primes[middle])
         {
            right = middle - 1;
         }
         else if(oldsize > primes[middle])
         {
            left = middle + 1;
         }
         else
         {
            assert(oldsize == primes[middle]);
            return primes[middle + 1];
         }
      }

      assert(left == right + 1);
      return primes[left];
   }